

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encrypted_client_hello.cc
# Opt level: O1

bool __thiscall
bssl::ssl_decode_client_hello_inner
          (bssl *this,SSL *ssl,uint8_t *out_alert,Array<unsigned_char> *out_client_hello_inner,
          Span<const_unsigned_char> encoded_client_hello_inner,SSL_CLIENT_HELLO *client_hello_outer)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint8_t *out_alert_00;
  uchar *puVar6;
  ulong len;
  uchar *puVar7;
  size_t sVar8;
  Span<const_unsigned_char> body_00;
  uint8_t padding;
  uint16_t want;
  uint16_t found;
  CBS ext_list;
  CBS ext_list_wrapper;
  CBS ext_body;
  CBS outer_extensions;
  CBB body;
  CBB extensions_cbb;
  SSL_CLIENT_HELLO client_hello_inner;
  CBS cbs;
  ScopedCBB cbb;
  uint8_t local_1c5;
  uint16_t local_1c4;
  uint16_t local_1c2;
  CBS local_1c0;
  CBB local_1b0;
  ulong local_180;
  size_t local_178;
  CBS local_170;
  CBS local_160;
  CBB local_150;
  CBB local_120;
  SSL_CLIENT_HELLO local_f0;
  CBS local_70;
  CBB local_60;
  
  sVar8 = encoded_client_hello_inner.size_;
  puVar7 = encoded_client_hello_inner.data_;
  local_70.data = (uint8_t *)out_client_hello_inner;
  local_70.len = (size_t)puVar7;
  bVar1 = ssl_parse_client_hello_with_trailing_data((SSL *)this,&local_70,&local_f0);
  if (!bVar1) {
    return false;
  }
  while (iVar3 = CBS_get_u8(&local_70,&local_1c5), iVar3 != 0) {
    if (local_1c5 != '\0') {
      ERR_put_error(0x10,0,0x89,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                    ,0x95);
      *(undefined1 *)&ssl->method = 0x2f;
      return false;
    }
  }
  if ((local_f0.extensions_len == 0) || (local_f0.session_id_len != 0)) {
    ERR_put_error(0x10,0,0x89,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                  ,0x9f);
    return false;
  }
  local_f0.session_id = *(uint8_t **)(sVar8 + 0x30);
  local_f0.session_id_len = *(size_t *)(sVar8 + 0x38);
  CBB_zero(&local_60);
  cVar2 = (**(code **)(*(long *)this + 0x58))(this,&local_60,&local_150,1);
  if (((((cVar2 == '\0') || (iVar3 = CBB_add_u16(&local_150,local_f0.version), iVar3 == 0)) ||
       (iVar3 = CBB_add_bytes(&local_150,local_f0.random,local_f0.random_len), iVar3 == 0)) ||
      (((iVar3 = CBB_add_u8_length_prefixed(&local_150,&local_1b0), iVar3 == 0 ||
        (iVar3 = CBB_add_bytes(&local_1b0,local_f0.session_id,local_f0.session_id_len), iVar3 == 0))
       || ((iVar3 = SSL_is_dtls(local_f0.ssl), iVar3 != 0 &&
           ((iVar3 = CBB_add_u8_length_prefixed(&local_150,&local_1b0), iVar3 == 0 ||
            (iVar3 = CBB_add_bytes(&local_1b0,local_f0.dtls_cookie,local_f0.dtls_cookie_len),
            iVar3 == 0)))))))) ||
     ((iVar3 = CBB_add_u16_length_prefixed(&local_150,&local_1b0), iVar3 == 0 ||
      ((((iVar3 = CBB_add_bytes(&local_1b0,local_f0.cipher_suites,local_f0.cipher_suites_len),
         iVar3 == 0 || (iVar3 = CBB_add_u8_length_prefixed(&local_150,&local_1b0), iVar3 == 0)) ||
        (iVar3 = CBB_add_bytes(&local_1b0,local_f0.compression_methods,
                               local_f0.compression_methods_len), iVar3 == 0)) ||
       ((iVar3 = CBB_flush(&local_150), iVar3 == 0 ||
        (iVar3 = CBB_add_u16_length_prefixed(&local_150,&local_120), iVar3 == 0)))))))) {
    bVar1 = false;
    ERR_put_error(0x10,0,0x44,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                  ,0xab);
    goto LAB_001357cf;
  }
  bVar1 = ssl_client_hello_get_extension(&local_f0,(CBS *)&local_1b0,0xfd00);
  if (bVar1) {
    local_180 = (long)local_1b0.child + (local_1b0._8_8_ - (long)local_f0.extensions);
    local_178 = local_f0.extensions_len - local_180;
    if (local_f0.extensions_len < local_180) {
      abort();
    }
    len = (long)local_1b0.child + (-4 - (long)local_f0.extensions);
    if (local_f0.extensions_len < len) {
      len = local_f0.extensions_len;
    }
    iVar3 = CBB_add_bytes(&local_120,local_f0.extensions,len);
    if (iVar3 == 0) {
      bVar1 = false;
      ERR_put_error(0x10,0,0x44,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                    ,0xc2);
      goto LAB_001357cf;
    }
    iVar3 = CBS_get_u8_length_prefixed((CBS *)&local_1b0,&local_1c0);
    if (((iVar3 == 0) || (local_1c0.len == 0)) || (local_1b0._8_8_ != 0)) {
      ERR_put_error(0x10,0,0x89,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                    ,0xca);
    }
    else {
      local_160.data = *(uint8_t **)(sVar8 + 0x70);
      local_160.len = *(size_t *)(sVar8 + 0x78);
      if (local_1c0.len != 0) {
        iVar3 = 0x89;
        do {
          iVar4 = CBS_get_u16(&local_1c0,&local_1c4);
          if (iVar4 == 0) {
            iVar4 = 0xd4;
            iVar3 = 0x89;
LAB_00135930:
            ERR_put_error(0x10,0,iVar3,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                          ,iVar4);
            goto LAB_0013590d;
          }
          if (local_1c4 == 0xfe0d) {
            *(undefined1 *)&ssl->method = 0x2f;
            iVar4 = 0xda;
            iVar3 = 0x140;
            goto LAB_00135930;
          }
          do {
            if (local_160.len == 0) {
              *(undefined1 *)&ssl->method = 0x2f;
              iVar4 = 0xe4;
              iVar3 = 0x140;
              goto LAB_001358f4;
            }
            iVar5 = CBS_get_u16(&local_160,&local_1c2);
            iVar4 = 0xe9;
            if ((iVar5 == 0) ||
               (iVar5 = CBS_get_u16_length_prefixed(&local_160,&local_170), iVar5 == 0))
            goto LAB_001358f4;
          } while (local_1c2 != local_1c4);
          iVar5 = CBB_add_u16(&local_120,local_1c2);
          iVar4 = 0xf2;
          if (((iVar5 == 0) || (iVar5 = CBB_add_u16(&local_120,(uint16_t)local_170.len), iVar5 == 0)
              ) || (iVar5 = CBB_add_bytes(&local_120,local_170.data,
                                          CONCAT62(local_170.len._2_6_,(uint16_t)local_170.len)),
                   iVar5 == 0)) {
LAB_001358f4:
            ERR_put_error(0x10,0,iVar3,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                          ,iVar4);
            goto LAB_0013590d;
          }
        } while (local_1c0.len != 0);
      }
      iVar3 = CBB_add_bytes(&local_120,local_f0.extensions + local_180,local_178);
      if (iVar3 != 0) goto LAB_0013580b;
      ERR_put_error(0x10,0,0x44,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                    ,0xf9);
    }
LAB_0013590d:
    bVar1 = false;
  }
  else {
    iVar3 = CBB_add_bytes(&local_120,local_f0.extensions,local_f0.extensions_len);
    if (iVar3 == 0) {
      iVar3 = 0xb7;
    }
    else {
LAB_0013580b:
      iVar3 = CBB_flush(&local_150);
      if (iVar3 == 0) {
        iVar3 = 0xfe;
      }
      else {
        out_alert_00 = CBB_data(&local_150);
        puVar6 = (uchar *)CBB_len(&local_150);
        body_00.size_ = (size_t)puVar7;
        body_00.data_ = puVar6;
        bVar1 = is_valid_client_hello_inner(this,ssl,out_alert_00,body_00);
        if (!bVar1) goto LAB_0013590d;
        cVar2 = (**(code **)(*(long *)this + 0x60))(this,&local_60,out_alert);
        iVar3 = 0x108;
        bVar1 = true;
        if (cVar2 != '\0') goto LAB_001357cf;
      }
    }
    bVar1 = false;
    ERR_put_error(0x10,0,0x44,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                  ,iVar3);
  }
LAB_001357cf:
  CBB_cleanup(&local_60);
  return bVar1;
}

Assistant:

bool ssl_decode_client_hello_inner(
    SSL *ssl, uint8_t *out_alert, Array<uint8_t> *out_client_hello_inner,
    Span<const uint8_t> encoded_client_hello_inner,
    const SSL_CLIENT_HELLO *client_hello_outer) {
  SSL_CLIENT_HELLO client_hello_inner;
  CBS cbs = encoded_client_hello_inner;
  if (!ssl_parse_client_hello_with_trailing_data(ssl, &cbs,
                                                 &client_hello_inner)) {
    return false;
  }
  // The remaining data is padding.
  uint8_t padding;
  while (CBS_get_u8(&cbs, &padding)) {
    if (padding != 0) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
      *out_alert = SSL_AD_ILLEGAL_PARAMETER;
      return false;
    }
  }

  // TLS 1.3 ClientHellos must have extensions, and EncodedClientHelloInners use
  // ClientHelloOuter's session_id.
  if (client_hello_inner.extensions_len == 0 ||
      client_hello_inner.session_id_len != 0) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
    return false;
  }
  client_hello_inner.session_id = client_hello_outer->session_id;
  client_hello_inner.session_id_len = client_hello_outer->session_id_len;

  // Begin serializing a message containing the ClientHelloInner in |cbb|.
  ScopedCBB cbb;
  CBB body, extensions_cbb;
  if (!ssl->method->init_message(ssl, cbb.get(), &body, SSL3_MT_CLIENT_HELLO) ||
      !ssl_client_hello_write_without_extensions(&client_hello_inner, &body) ||
      !CBB_add_u16_length_prefixed(&body, &extensions_cbb)) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return false;
  }

  auto inner_extensions =
      Span(client_hello_inner.extensions, client_hello_inner.extensions_len);
  CBS ext_list_wrapper;
  if (!ssl_client_hello_get_extension(&client_hello_inner, &ext_list_wrapper,
                                      TLSEXT_TYPE_ech_outer_extensions)) {
    // No ech_outer_extensions. Copy everything.
    if (!CBB_add_bytes(&extensions_cbb, inner_extensions.data(),
                       inner_extensions.size())) {
      OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
      return false;
    }
  } else {
    const size_t offset = CBS_data(&ext_list_wrapper) - inner_extensions.data();
    auto inner_extensions_before =
        inner_extensions.subspan(0, offset - 4 /* extension header */);
    auto inner_extensions_after =
        inner_extensions.subspan(offset + CBS_len(&ext_list_wrapper));
    if (!CBB_add_bytes(&extensions_cbb, inner_extensions_before.data(),
                       inner_extensions_before.size())) {
      OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
      return false;
    }

    // Expand ech_outer_extensions. See draft-ietf-tls-esni-13, Appendix B.
    CBS ext_list;
    if (!CBS_get_u8_length_prefixed(&ext_list_wrapper, &ext_list) ||
        CBS_len(&ext_list) == 0 || CBS_len(&ext_list_wrapper) != 0) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
      return false;
    }
    CBS outer_extensions;
    CBS_init(&outer_extensions, client_hello_outer->extensions,
             client_hello_outer->extensions_len);
    while (CBS_len(&ext_list) != 0) {
      // Find the next extension to copy.
      uint16_t want;
      if (!CBS_get_u16(&ext_list, &want)) {
        OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
        return false;
      }
      // The ECH extension itself is not in the AAD and may not be referenced.
      if (want == TLSEXT_TYPE_encrypted_client_hello) {
        *out_alert = SSL_AD_ILLEGAL_PARAMETER;
        OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_OUTER_EXTENSION);
        return false;
      }
      // Seek to |want| in |outer_extensions|. |ext_list| is required to match
      // ClientHelloOuter in order.
      uint16_t found;
      CBS ext_body;
      do {
        if (CBS_len(&outer_extensions) == 0) {
          *out_alert = SSL_AD_ILLEGAL_PARAMETER;
          OPENSSL_PUT_ERROR(SSL, SSL_R_INVALID_OUTER_EXTENSION);
          return false;
        }
        if (!CBS_get_u16(&outer_extensions, &found) ||
            !CBS_get_u16_length_prefixed(&outer_extensions, &ext_body)) {
          OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
          return false;
        }
      } while (found != want);
      // Copy the extension.
      if (!CBB_add_u16(&extensions_cbb, found) ||
          !CBB_add_u16(&extensions_cbb, CBS_len(&ext_body)) ||
          !CBB_add_bytes(&extensions_cbb, CBS_data(&ext_body),
                         CBS_len(&ext_body))) {
        OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
        return false;
      }
    }

    if (!CBB_add_bytes(&extensions_cbb, inner_extensions_after.data(),
                       inner_extensions_after.size())) {
      OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
      return false;
    }
  }
  if (!CBB_flush(&body)) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return false;
  }

  if (!is_valid_client_hello_inner(ssl, out_alert,
                                   Span(CBB_data(&body), CBB_len(&body)))) {
    return false;
  }

  if (!ssl->method->finish_message(ssl, cbb.get(), out_client_hello_inner)) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return false;
  }
  return true;
}